

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O2

double ON_KnotTolerance(int order,int cv_count,double *knot,int knot_index)

{
  double dVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  
  iVar2 = order + cv_count + -2;
  iVar5 = -1;
  if (-1 < knot_index - order) {
    iVar5 = knot_index - order;
  }
  uVar4 = iVar5 + 1;
  iVar5 = order + knot_index;
  if (iVar2 <= order + knot_index) {
    iVar5 = iVar2;
  }
  iVar5 = iVar5 + -1;
  lVar3 = (long)knot_index;
  uVar6 = uVar4;
  if (knot_index < (int)uVar4) {
    uVar6 = knot_index;
  }
  dVar1 = knot[lVar3];
  for (lVar7 = lVar3; (long)(ulong)uVar4 < lVar7; lVar7 = lVar7 + -1) {
    if ((knot[lVar7] != dVar1) || (NAN(knot[lVar7]) || NAN(dVar1))) {
      uVar6 = (uint)lVar7;
      break;
    }
  }
  dVar8 = dVar1 - knot[(int)uVar6];
  if (knot_index <= iVar5) {
    knot_index = iVar5;
  }
  do {
    if (iVar5 <= lVar3) {
LAB_004d7727:
      dVar9 = dVar1 - knot[knot_index];
      if ((((dVar8 == 0.0) && (!NAN(dVar8))) && (dVar9 == 0.0)) && (!NAN(dVar9))) {
        return 0.0;
      }
      return (ABS(dVar1) + ABS(dVar8) + ABS(dVar9)) * 1.490116119385e-08;
    }
    if ((knot[lVar3] != dVar1) || (NAN(knot[lVar3]) || NAN(dVar1))) {
      knot_index = (int)lVar3;
      goto LAB_004d7727;
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

int ON_KnotCount( int order, int cv_count )
{
  return (order+cv_count-2);
}